

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O0

void __thiscall
cmExtraCodeBlocksGenerator::CreateProjectFile
          (cmExtraCodeBlocksGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs)

{
  const_reference ppcVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_d0 [8];
  string sessionFilename;
  undefined1 local_90 [8];
  string filename;
  string projectName;
  allocator local_39;
  undefined1 local_38 [8];
  string outputDir;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs_local;
  cmExtraCodeBlocksGenerator *this_local;
  
  outputDir.field_2._8_8_ = lgs;
  ppcVar1 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[](lgs,0);
  pcVar2 = cmLocalGenerator::GetCurrentBinaryDirectory(*ppcVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_38,pcVar2,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  ppcVar1 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                      ((vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *)
                       outputDir.field_2._8_8_,0);
  cmLocalGenerator::GetProjectName_abi_cxx11_((string *)((long)&filename.field_2 + 8),*ppcVar1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,"/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&sessionFilename.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&filename.field_2 + 8),".cbp");
  std::__cxx11::string::operator+=
            ((string *)local_90,(string *)(sessionFilename.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sessionFilename.field_2._M_local_buf + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,"/");
  std::operator+(&local_f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&filename.field_2 + 8),".layout");
  std::__cxx11::string::operator+=((string *)local_d0,(string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  CreateNewProjectFile
            (this,(vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *)
                  outputDir.field_2._8_8_,(string *)local_90);
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)(filename.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmExtraCodeBlocksGenerator::CreateProjectFile(
                                     const std::vector<cmLocalGenerator*>& lgs)
{
  std::string outputDir=lgs[0]->GetCurrentBinaryDirectory();
  std::string projectName=lgs[0]->GetProjectName();

  std::string filename=outputDir+"/";
  filename+=projectName+".cbp";
  std::string sessionFilename=outputDir+"/";
  sessionFilename+=projectName+".layout";

  this->CreateNewProjectFile(lgs, filename);
}